

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

ON_3dVector * __thiscall
ON_HermiteSurface::UTangentAt
          (ON_3dVector *__return_storage_ptr__,ON_HermiteSurface *this,int u,int v)

{
  bool bVar1;
  ON_SimpleArray<ON_3dVector> *this_00;
  ON_3dVector *pOVar2;
  int v_local;
  int u_local;
  ON_HermiteSurface *this_local;
  
  __return_storage_ptr__->x = ON_3dVector::UnsetVector.x;
  __return_storage_ptr__->y = ON_3dVector::UnsetVector.y;
  __return_storage_ptr__->z = ON_3dVector::UnsetVector.z;
  bVar1 = InBounds(this,u,v);
  if (bVar1) {
    this_00 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::operator[](&this->m_u_tangents,u);
    pOVar2 = ON_SimpleArray<ON_3dVector>::operator[](this_00,v);
    __return_storage_ptr__->x = pOVar2->x;
    __return_storage_ptr__->y = pOVar2->y;
    __return_storage_ptr__->z = pOVar2->z;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_HermiteSurface::UTangentAt(int u, int v) const
{
  ON_3dVector rc = ON_3dVector::UnsetVector;
  if (InBounds(u, v))
    rc = m_u_tangents[u][v];
  return rc;
}